

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

Element __thiscall ftxui::anon_unknown_3::ButtonBase::Render(ButtonBase *this)

{
  bool bVar1;
  ButtonOption *pBVar2;
  string *psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ComponentBase *in_RSI;
  Element EVar4;
  _func_shared_ptr<ftxui::Node>_shared_ptr<ftxui::Node> *local_110;
  _func_Element_Element *local_108;
  Decorator local_e8;
  Decorator local_c8;
  Decorator local_a8;
  string local_78;
  Element local_58;
  Element local_48;
  Element local_38;
  _func_shared_ptr<ftxui::Node>_shared_ptr<ftxui::Node> *local_28;
  _func_Element_Element *my_border;
  _func_Element_Element *style;
  ButtonBase *this_local;
  
  this_local = this;
  bVar1 = ComponentBase::Focused(in_RSI);
  if (bVar1) {
    local_108 = inverted;
  }
  else {
    local_108 = nothing;
  }
  my_border = local_108;
  pBVar2 = Ref<ftxui::ButtonOption>::operator->((Ref<ftxui::ButtonOption> *)&in_RSI[3].children_);
  if ((pBVar2->border & 1U) == 0) {
    local_110 = nothing;
  }
  else {
    local_110 = border;
  }
  local_28 = local_110;
  psVar3 = ConstStringRef::operator*[abi_cxx11_((ConstStringRef *)(in_RSI + 1));
  std::__cxx11::string::string((string *)&local_78,(string *)psVar3);
  text((ftxui *)&local_58,&local_78);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(*&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_a8,
             &local_28);
  operator|((ftxui *)&local_48,&local_58,&local_a8);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(*&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_c8,
             (_func_shared_ptr<ftxui::Node>_shared_ptr<ftxui::Node> **)&my_border);
  operator|((ftxui *)&local_38,&local_48,&local_c8);
  reflect(&local_e8,(Box *)&in_RSI[2].parent_);
  operator|((ftxui *)this,&local_38,&local_e8);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_e8);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_38);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_c8);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_48);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_a8);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    auto style = Focused() ? inverted : nothing;
    auto my_border = option_->border ? border : nothing;
    return text(*label_) | my_border | style | reflect(box_);
  }